

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

undefined8 svg::attribute<char[3]>(string *attribute_name,char (*value) [3],string *unit)

{
  ostream *poVar1;
  string *in_RCX;
  char *in_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  stringstream ss;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  string *local_20;
  char *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,local_10);
  poVar1 = std::operator<<(poVar1,"=\"");
  poVar1 = std::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1,local_20);
  std::operator<<(poVar1,"\" ");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

inline std::string attribute(std::string const & attribute_name,
        T const & value, std::string const & unit = "")
    {
        std::stringstream ss;
        ss << attribute_name << "=\"" << value << unit << "\" ";
        return ss.str();
    }